

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O0

DVector2 P_GetOffsetPosition(double x,double y,double dx,double dy)

{
  line_t_conflict *src;
  int x_00;
  int y_00;
  FPortalBlock *pFVar1;
  intercept_t *piVar2;
  TVector2<double> *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar3;
  double b;
  DVector2 DVar4;
  undefined1 local_c8 [8];
  DVector2 hit;
  FLinePortal *port;
  line_t_conflict *line;
  intercept_t *in;
  undefined1 local_90 [8];
  FLinePortalTraverse it;
  bool repeat;
  int blocky;
  int blockx;
  double acty;
  double actx;
  double dy_local;
  double dx_local;
  double y_local;
  double x_local;
  DVector2 *dest;
  
  b = y + dy;
  TVector2<double>::TVector2(in_RDI,x + dx,b);
  dVar3 = extraout_XMM0_Qa;
  if ((PortalBlockmap.containsLines & 1U) != 0) {
    _blocky = y;
    if ((dx < 128.0) && (dy < 128.0)) {
      x_00 = GetBlockX(x);
      y_00 = GetBlockY(y);
      dVar3 = extraout_XMM0_Qa_00;
      if (((x_00 < 0) || (((y_00 < 0 || (bmapwidth <= x_00)) || (bmapheight <= y_00)))) ||
         (pFVar1 = FPortalBlockmap::operator()(&PortalBlockmap,x_00,y_00),
         dVar3 = extraout_XMM0_Qa_01, (pFVar1->neighborContainsLines & 1U) == 0)) goto LAB_00633889;
    }
    do {
      FLinePortalTraverse::FLinePortalTraverse((FLinePortalTraverse *)local_90);
      b = _blocky;
      FPathTraverse::init((FPathTraverse *)local_90,(EVP_PKEY_CTX *)0x9);
      it.super_FPathTraverse._63_1_ = 0;
      piVar2 = FPathTraverse::Next((FPathTraverse *)local_90);
      if (piVar2 != (intercept_t *)0x0) {
        src = (piVar2->d).line;
        hit.Y = (double)line_t::getPortal((line_t *)src);
        if ((((FLinePortal *)hit.Y)->mFlags & 8) != 0) {
          DVar4 = FPathTraverse::InterceptPoint((FPathTraverse *)local_c8,(intercept_t *)local_90);
          b = DVar4.Y;
          if (*(char *)((long)hit.Y + 0x20) == '\x03') {
            TVector2<double>::operator+=
                      ((TVector2<double> *)local_c8,(TVector2<double> *)((long)hit.Y + 0x10));
            TVector2<double>::operator+=(in_RDI,(TVector2<double> *)((long)hit.Y + 0x10));
          }
          else {
            P_TranslatePortalXY(src,(double *)local_c8,&hit.X);
            P_TranslatePortalXY(src,&in_RDI->X,&in_RDI->Y);
          }
          _blocky = hit.X;
          it.super_FPathTraverse._63_1_ = 1;
        }
      }
      FLinePortalTraverse::~FLinePortalTraverse((FLinePortalTraverse *)local_90);
      dVar3 = extraout_XMM0_Qa_02;
    } while ((it.super_FPathTraverse._63_1_ & 1) != 0);
  }
LAB_00633889:
  DVar4.Y = b;
  DVar4.X = dVar3;
  return DVar4;
}

Assistant:

DVector2 P_GetOffsetPosition(double x, double y, double dx, double dy)
{
	DVector2 dest(x + dx, y + dy);
	if (PortalBlockmap.containsLines)
	{
		double actx = x, acty = y;
		// Try some easily discoverable early-out first. If we know that the trace cannot possibly find a portal, this saves us from calling the traverser completely for vast parts of the map.
		if (dx < 128 && dy < 128)
		{
			int blockx = GetBlockX(actx);
			int blocky = GetBlockY(acty);
			if (blockx < 0 || blocky < 0 || blockx >= bmapwidth || blocky >= bmapheight || !PortalBlockmap(blockx, blocky).neighborContainsLines) return dest;
		}

		bool repeat;
		do
		{
			FLinePortalTraverse it;
			it.init(actx, acty, dx, dy, PT_ADDLINES|PT_DELTA);
			intercept_t *in;

			repeat = false;
			while ((in = it.Next()))
			{
				// hit a portal line.
				line_t *line = in->d.line;
				FLinePortal *port = line->getPortal();

				// Teleport portals are intentionally ignored since skipping this stuff is their entire reason for existence.
				if (port->mFlags & PORTF_INTERACTIVE)
				{
					DVector2 hit = it.InterceptPoint(in);

					if (port->mType == PORTT_LINKED)
					{
						// optimized handling for linked portals where we only need to add an offset.
						hit += port->mDisplacement;
						dest += port->mDisplacement;
					}
					else
					{
						// interactive ones are more complex because the vector may be rotated.
						// Note: There is no z-translation here, there's just too much code in the engine that wouldn't be able to handle interactive portals with a height difference.
						P_TranslatePortalXY(line, hit.X, hit.Y);
						P_TranslatePortalXY(line, dest.X, dest.Y);
					}
					// update the fields, end this trace and restart from the new position
					dx = dest.X - hit.X;
					dy = dest.Y - hit.Y;
					actx = hit.X;
					acty = hit.Y;
					repeat = true;
				}

				break;
			}
		} while (repeat);
	}
	return dest;
}